

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyBumpObject(TidyDocImpl *doc,Node *html)

{
  Dict *pDVar1;
  Bool BVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *node;
  Node *element;
  
  if (html != (Node *)0x0) {
    pNVar4 = html->content;
    if (pNVar4 == (Node *)0x0) {
      pNVar3 = (Node *)0x0;
      element = (Node *)0x0;
    }
    else {
      element = (Node *)0x0;
      pNVar3 = (Node *)0x0;
      do {
        pDVar1 = pNVar4->tag;
        if ((pDVar1 != (Dict *)0x0) && (pDVar1->id == TidyTag_HEAD)) {
          pNVar3 = pNVar4;
        }
        if ((pDVar1 != (Dict *)0x0) && (pDVar1->id == TidyTag_BODY)) {
          element = pNVar4;
        }
        pNVar4 = pNVar4->next;
      } while (pNVar4 != (Node *)0x0);
    }
    if ((pNVar3 != (Node *)0x0) && (element != (Node *)0x0)) {
      pNVar4 = pNVar3->content;
LAB_0014d101:
      pNVar3 = pNVar4;
      if (pNVar3 != (Node *)0x0) {
        pNVar4 = pNVar3->next;
        if ((pNVar3->tag != (Dict *)0x0) && (pNVar3->tag->id == TidyTag_OBJECT)) {
          for (node = pNVar3->content; node != (Node *)0x0; node = node->next) {
            BVar2 = prvTidynodeIsText(node);
            if ((((BVar2 != no) && (BVar2 = prvTidyIsBlank(doc->lexer,pNVar3), BVar2 == no)) ||
                (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_PARAM)) {
              prvTidyRemoveNode(pNVar3);
              prvTidyInsertNodeAtStart(element,pNVar3);
              break;
            }
          }
        }
        goto LAB_0014d101;
      }
    }
  }
  return;
}

Assistant:

void TY_(BumpObject)( TidyDocImpl* doc, Node *html )
{
    Node *node, *next, *head = NULL, *body = NULL;

    if (!html)
        return;

    for ( node = html->content; node != NULL; node = node->next )
    {
        if ( nodeIsHEAD(node) )
            head = node;

        if ( nodeIsBODY(node) )
            body = node;
    }

    if ( head != NULL && body != NULL )
    {
        for (node = head->content; node != NULL; node = next)
        {
            next = node->next;

            if ( nodeIsOBJECT(node) )
            {
                Node *child;
                Bool bump = no;

                for (child = node->content; child != NULL; child = child->next)
                {
                    /* bump to body unless content is param */
                    if ( (TY_(nodeIsText)(child) && !TY_(IsBlank)(doc->lexer, node))
                         || !nodeIsPARAM(child) )
                    {
                            bump = yes;
                            break;
                    }
                }

                if ( bump )
                {
                    TY_(RemoveNode)( node );
                    TY_(InsertNodeAtStart)( body, node );
                }
            }
        }
    }
}